

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaUnit.cpp
# Opt level: O0

uint __thiscall NaUnit::NeedFeedback(NaUnit *this)

{
  long *plVar1;
  long *in_RDI;
  uint nTimeIndex;
  uint local_4;
  
  plVar1 = (long *)(**(code **)(*in_RDI + 0x18))();
  local_4 = (**(code **)(*plVar1 + 0x28))();
  if (local_4 < *(uint *)(in_RDI + 3)) {
    local_4 = (int)in_RDI[3] - local_4;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned
NaUnit::NeedFeedback ()
{
    unsigned    nTimeIndex = (unsigned)Timer().CurrentIndex();

    if(nTimeIndex >= nFbDepth)
        // All needed feedback values are already computed by the unit
        return 0;
    // Some feedback values are still needed.
    return nFbDepth - nTimeIndex;
}